

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

int SSL_ech_accepted(SSL *ssl)

{
  bool bVar1;
  int iVar2;
  pointer pSVar3;
  SSL *ssl_local;
  
  iVar2 = SSL_in_early_data(ssl);
  if ((iVar2 == 0) || ((ssl->field_0xa4 & 1) != 0)) {
    bVar1 = ssl->s3->ech_status == ssl_ech_accepted;
  }
  else {
    pSVar3 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::operator->(&ssl->s3->hs)
    ;
    bVar1 = std::operator!=(&pSVar3->selected_ech_config,(nullptr_t)0x0);
  }
  ssl_local._4_4_ = (uint)bVar1;
  return ssl_local._4_4_;
}

Assistant:

int SSL_ech_accepted(const SSL *ssl) {
  if (SSL_in_early_data(ssl) && !ssl->server) {
    // In the client early data state, we report properties as if the server
    // accepted early data. The server can only accept early data with
    // ClientHelloInner.
    return ssl->s3->hs->selected_ech_config != nullptr;
  }

  return ssl->s3->ech_status == ssl_ech_accepted;
}